

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zgsrfs.c
# Opt level: O2

void zgsrfs(trans_t trans,SuperMatrix *A,SuperMatrix *L,SuperMatrix *U,int *perm_c,int *perm_r,
           char *equed,double *R,double *C,SuperMatrix *B,SuperMatrix *X,double *ferr,double *berr,
           SuperLUStat_t *stat,int *info)

{
  double *est;
  double dVar1;
  char cVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  void *pvVar6;
  doublecomplex beta;
  void *pvVar7;
  int iVar8;
  long lVar9;
  ulong uVar10;
  long lVar11;
  long lVar12;
  ulong uVar13;
  int iVar14;
  byte bVar15;
  long lVar16;
  long lVar17;
  doublecomplex *pdVar18;
  int iVar19;
  long lVar20;
  doublecomplex *pdVar21;
  bool bVar22;
  double dVar23;
  char transc [1];
  int local_26c;
  double local_268;
  undefined8 uStack_260;
  doublecomplex *local_258;
  void *local_250;
  double local_248;
  long local_240;
  trans_t local_234;
  uint local_230;
  int kase;
  int nrow;
  int ione;
  ulong local_220;
  doublecomplex *local_218;
  doublecomplex *local_210;
  ulong local_208;
  int *local_200;
  long local_1f8;
  doublecomplex *local_1f0;
  double local_1e8;
  SuperMatrix *local_1e0;
  SuperMatrix *local_1d8;
  double local_1d0;
  int *local_1c8;
  int *local_1c0;
  long local_1b8;
  long local_1b0;
  double local_1a8;
  double local_1a0;
  doublecomplex *local_198;
  doublecomplex *local_190;
  SuperMatrix local_188;
  doublecomplex done;
  int isave [3];
  
  ione = 1;
  nrow = A->nrow;
  done.r = 1.0;
  done.i = 0.0;
  pvVar6 = A->Store;
  lVar11 = *(long *)((long)pvVar6 + 8);
  pdVar21 = *(doublecomplex **)((long)B->Store + 8);
  local_190 = *(doublecomplex **)((long)X->Store + 8);
  iVar19 = *B->Store;
  iVar3 = *X->Store;
  lVar9 = (long)iVar3;
  uVar4 = B->ncol;
  uVar13 = (ulong)uVar4;
  *info = 0;
  local_1e0 = U;
  local_1d8 = L;
  if (CONJ < trans) {
    iVar8 = 1;
    iVar14 = -1;
LAB_0010431f:
    *info = iVar14;
    local_26c = iVar8;
    input_error("zgsrfs",&local_26c);
    return;
  }
  uVar5 = A->nrow;
  iVar8 = 2;
  iVar14 = -2;
  local_1b8 = lVar9;
  local_198 = pdVar21;
  if (((((int)uVar5 < 0) || (uVar5 != A->ncol)) || (A->Stype != SLU_NC)) ||
     ((A->Dtype != SLU_Z || (A->Mtype != SLU_GE)))) goto LAB_0010431f;
  iVar8 = 3;
  iVar14 = -3;
  local_1f8 = lVar11;
  local_1c0 = perm_c;
  if ((((L->nrow < 0) || ((L->nrow != L->ncol || (L->Stype != SLU_SC)))) || (L->Dtype != SLU_Z)) ||
     (L->Mtype != SLU_TRLU)) goto LAB_0010431f;
  iVar8 = 4;
  iVar14 = -4;
  if ((((U->nrow < 0) || (U->nrow != U->ncol)) || (U->Stype != SLU_NC)) ||
     ((U->Dtype != SLU_Z || (U->Mtype != SLU_TRU)))) goto LAB_0010431f;
  iVar8 = 10;
  iVar14 = -10;
  local_208 = uVar13;
  local_1c8 = perm_r;
  if (((iVar19 < (int)uVar5) || ((B->Stype != SLU_DN || (B->Dtype != SLU_Z)))) ||
     (B->Mtype != SLU_GE)) goto LAB_0010431f;
  iVar8 = 0xb;
  iVar14 = -0xb;
  if ((((iVar3 < (int)uVar5) || (X->Stype != SLU_DN)) || (X->Dtype != SLU_Z)) ||
     (X->Mtype != SLU_GE)) goto LAB_0010431f;
  if (uVar4 == 0 || (ulong)uVar5 == 0) {
    uVar10 = 0;
    if ((int)uVar4 < 1) {
      uVar13 = uVar10;
    }
    for (; uVar13 != uVar10; uVar10 = uVar10 + 1) {
      ferr[uVar10] = 0.0;
      berr[uVar10] = 0.0;
    }
    return;
  }
  cVar2 = *equed;
  bVar22 = true;
  if (cVar2 != 'R') {
    bVar22 = cVar2 == 'B';
    local_268 = (double)CONCAT71(local_268._1_7_,1);
    if (cVar2 == 'C') goto LAB_001044a9;
  }
  local_268 = (double)CONCAT71(local_268._1_7_,cVar2 == 'B');
LAB_001044a9:
  local_258 = doublecomplexMalloc((ulong)uVar5 * 2);
  local_250 = superlu_malloc((long)A->nrow << 3);
  local_200 = int32Malloc(A->nrow);
  if ((local_250 == (void *)0x0 || local_258 == (doublecomplex *)0x0) || local_200 == (int *)0x0) {
    sprintf((char *)isave,"%s at line %d in file %s\n","Malloc fails for work/rwork/iwork.",0xe3,
            "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/zgsrfs.c");
    superlu_abort_and_exit((char *)isave);
  }
  if (trans == NOTRANS) {
    transc[0] = 'N';
    local_234 = TRANS;
  }
  else {
    if (trans == TRANS) {
      transc[0] = 'T';
    }
    else {
      transc[0] = 'C';
    }
    local_234 = NOTRANS;
  }
  local_1b0 = (long)iVar19;
  local_248 = (double)CONCAT44(local_248._4_4_,A->ncol + 1);
  local_1d0 = dmach("Epsilon");
  local_1e8 = dmach("Safe minimum");
  local_1e8 = (double)local_248._0_4_ * local_1e8;
  for (lVar11 = 0; (int)lVar11 < A->nrow; lVar11 = lVar11 + 1) {
    local_200[lVar11] = 0;
  }
  lVar11 = 0;
  if (trans == NOTRANS) {
    while (lVar11 < A->ncol) {
      lVar20 = *(long *)((long)pvVar6 + 0x18);
      lVar9 = lVar11 * 4;
      lVar11 = lVar11 + 1;
      for (lVar9 = (long)*(int *)(lVar20 + lVar9); local_26c = (int)lVar9,
          local_26c < *(int *)(lVar20 + lVar11 * 4); lVar9 = lVar9 + 1) {
        local_200[*(int *)(*(long *)((long)pvVar6 + 0x10) + lVar9 * 4)] =
             local_200[*(int *)(*(long *)((long)pvVar6 + 0x10) + lVar9 * 4)] + 1;
      }
    }
  }
  else {
    for (; lVar11 < A->ncol; lVar11 = lVar11 + 1) {
      local_200[lVar11] =
           *(int *)(*(long *)((long)pvVar6 + 0x18) + 4 + lVar11 * 4) -
           *(int *)(*(long *)((long)pvVar6 + 0x18) + lVar11 * 4);
    }
  }
  local_188.Stype = B->Stype;
  local_188.Dtype = B->Dtype;
  local_188.Mtype = B->Mtype;
  local_188.nrow = B->nrow;
  local_188.ncol = 1;
  local_188.Store = superlu_malloc(0x10);
  lVar9 = local_1b0;
  lVar11 = local_1b8;
  if ((int *)local_188.Store == (int *)0x0) {
    sprintf((char *)isave,"%s at line %d in file %s\n","SUPERLU_MALLOC fails for Bjcol.Store",0x10c,
            "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/zgsrfs.c");
    superlu_abort_and_exit((char *)isave);
  }
  local_1a0 = local_1e8 / local_1d0;
  *(int *)local_188.Store = iVar19;
  *(doublecomplex **)((long)local_188.Store + 8) = local_258;
  bVar15 = trans == NOTRANS & local_268._0_1_;
  bVar22 = (bool)(bVar22 & trans != NOTRANS);
  iVar19 = (int)local_208;
  local_208 = local_208 & 0xffffffff;
  if (iVar19 < 1) {
    local_208 = 0;
  }
  local_210 = local_190;
  local_1f0 = local_198;
  local_220 = 0;
LAB_00104713:
  if (local_220 == local_208) {
    superlu_free(local_258);
    superlu_free(local_250);
    superlu_free(local_200);
    superlu_free(local_188.Store);
    return;
  }
  pdVar21 = local_198 + local_220 * local_1b0;
  local_218 = local_190 + local_220 * local_1b8;
  local_230 = 0;
  local_1a8 = 3.0;
  do {
    pdVar18 = local_258;
    zcopy_(&nrow,pdVar21,&ione,local_258,&ione);
    beta.i = done.i;
    beta.r = done.r;
    sp_zgemv(transc,(doublecomplex)ZEXT816(0xbff0000000000000),A,local_218,ione,beta,pdVar18,ione);
    pvVar7 = local_250;
    pdVar18 = local_1f0;
    for (lVar20 = 0; (int)lVar20 < A->nrow; lVar20 = lVar20 + 1) {
      dVar23 = z_abs1(pdVar18);
      *(double *)((long)pvVar7 + lVar20 * 8) = dVar23;
      pdVar18 = pdVar18 + 1;
    }
    if (trans == NOTRANS) {
      lVar20 = 0;
      while (lVar20 < A->ncol) {
        local_268 = z_abs1(local_218 + lVar20);
        lVar12 = *(long *)((long)pvVar6 + 0x18);
        lVar17 = (long)*(int *)(lVar12 + lVar20 * 4);
        lVar20 = lVar20 + 1;
        pdVar18 = (doublecomplex *)(lVar17 * 0x10 + local_1f8);
        for (; local_26c = (int)lVar17, local_26c < *(int *)(lVar12 + lVar20 * 4);
            lVar17 = lVar17 + 1) {
          dVar23 = z_abs1(pdVar18);
          lVar12 = (long)*(int *)(*(long *)((long)pvVar6 + 0x10) + lVar17 * 4);
          *(double *)((long)local_250 + lVar12 * 8) =
               dVar23 * local_268 + *(double *)((long)local_250 + lVar12 * 8);
          lVar12 = *(long *)((long)pvVar6 + 0x18);
          pdVar18 = pdVar18 + 1;
        }
      }
    }
    else {
      lVar20 = local_1f8;
      lVar12 = 0;
      while (lVar12 < A->ncol) {
        lVar17 = *(long *)((long)pvVar6 + 0x18);
        lVar16 = (long)*(int *)(lVar17 + lVar12 * 4);
        local_240 = lVar12 + 1;
        pdVar18 = (doublecomplex *)(lVar16 * 0x10 + lVar20);
        dVar23 = 0.0;
        for (; local_26c = (int)lVar16, local_26c < *(int *)(lVar17 + local_240 * 4);
            lVar16 = lVar16 + 1) {
          iVar19 = *(int *)(*(long *)((long)pvVar6 + 0x10) + lVar16 * 4);
          local_268 = dVar23;
          local_248 = z_abs1(pdVar18);
          dVar23 = z_abs1(local_218 + iVar19);
          local_268 = local_268 + dVar23 * local_248;
          lVar17 = *(long *)((long)pvVar6 + 0x18);
          pdVar18 = pdVar18 + 1;
          lVar20 = local_1f8;
          dVar23 = local_268;
        }
        *(double *)((long)local_250 + lVar12 * 8) =
             dVar23 + *(double *)((long)local_250 + lVar12 * 8);
        lVar12 = local_240;
      }
    }
    pvVar7 = local_250;
    dVar23 = 0.0;
    lVar20 = 0;
    pdVar18 = local_258;
    while( true ) {
      local_26c = (int)lVar20;
      iVar19 = A->nrow;
      if (iVar19 <= local_26c) break;
      dVar1 = *(double *)((long)pvVar7 + lVar20 * 8);
      if (dVar1 <= local_1a0) {
        if (((dVar1 != 0.0) || (NAN(dVar1))) &&
           (local_268 = dVar23, dVar1 = z_abs1(pdVar18), dVar23 = local_268,
           local_268 <= (dVar1 + local_1e8) / *(double *)((long)pvVar7 + lVar20 * 8))) {
          dVar23 = z_abs1(pdVar18);
          dVar23 = dVar23 + local_1e8;
          goto LAB_001049fe;
        }
      }
      else {
        local_268 = dVar23;
        dVar1 = z_abs1(pdVar18);
        dVar23 = local_268;
        if (local_268 <= dVar1 / *(double *)((long)pvVar7 + lVar20 * 8)) {
          dVar23 = z_abs1(pdVar18);
LAB_001049fe:
          dVar23 = dVar23 / *(double *)((long)pvVar7 + lVar20 * 8);
        }
      }
      lVar20 = lVar20 + 1;
      pdVar18 = pdVar18 + 1;
    }
    berr[local_220] = dVar23;
    if (((dVar23 <= local_1d0) || (local_1a8 < dVar23 + dVar23)) || (4 < local_230)) break;
    zgstrs(trans,local_1d8,local_1e0,local_1c0,local_1c8,&local_188,stat,info);
    zaxpy_(&nrow,&done,local_258,&ione,local_218,&ione);
    local_1a8 = berr[local_220];
    local_230 = local_230 + 1;
  } while( true );
  stat->RefineSteps = local_230;
  pdVar21 = local_1f0;
  for (lVar20 = 0; (int)lVar20 < iVar19; lVar20 = lVar20 + 1) {
    dVar23 = z_abs1(pdVar21);
    *(double *)((long)local_250 + lVar20 * 8) = dVar23;
    iVar19 = A->nrow;
    pdVar21 = pdVar21 + 1;
  }
  if (trans == NOTRANS) {
    lVar20 = 0;
    while (lVar20 < A->ncol) {
      local_268 = z_abs1(local_218 + lVar20);
      lVar12 = *(long *)((long)pvVar6 + 0x18);
      lVar17 = (long)*(int *)(lVar12 + lVar20 * 4);
      lVar20 = lVar20 + 1;
      pdVar21 = (doublecomplex *)(lVar17 * 0x10 + local_1f8);
      for (; local_26c = (int)lVar17, local_26c < *(int *)(lVar12 + lVar20 * 4); lVar17 = lVar17 + 1
          ) {
        dVar23 = z_abs1(pdVar21);
        lVar12 = (long)*(int *)(*(long *)((long)pvVar6 + 0x10) + lVar17 * 4);
        *(double *)((long)local_250 + lVar12 * 8) =
             dVar23 * local_268 + *(double *)((long)local_250 + lVar12 * 8);
        lVar12 = *(long *)((long)pvVar6 + 0x18);
        pdVar21 = pdVar21 + 1;
      }
    }
  }
  else {
    local_240 = 0;
    while (local_240 < A->ncol) {
      lVar12 = *(long *)((long)pvVar6 + 0x18);
      lVar17 = (long)*(int *)(lVar12 + local_240 * 4);
      lVar20 = local_240 + 1;
      pdVar21 = (doublecomplex *)(lVar17 * 0x10 + local_1f8);
      local_268 = 0.0;
      for (; local_26c = (int)lVar17, local_26c < *(int *)(lVar12 + lVar20 * 4); lVar17 = lVar17 + 1
          ) {
        local_248 = z_abs1(local_218 + *(int *)(*(long *)((long)pvVar6 + 0x10) + lVar17 * 4));
        dVar23 = z_abs1(pdVar21);
        local_268 = local_268 + dVar23 * local_248;
        lVar12 = *(long *)((long)pvVar6 + 0x18);
        pdVar21 = pdVar21 + 1;
      }
      *(double *)((long)local_250 + local_240 * 8) =
           local_268 + *(double *)((long)local_250 + local_240 * 8);
      local_240 = lVar20;
    }
  }
  pdVar21 = local_258;
  for (lVar20 = 0; pvVar7 = local_250, (int)lVar20 < A->nrow; lVar20 = lVar20 + 1) {
    local_268 = (double)-(ulong)(local_1a0 < *(double *)((long)local_250 + lVar20 * 8));
    uStack_260 = 0;
    dVar23 = z_abs(pdVar21);
    dVar23 = (double)(local_200[lVar20] + 1) * local_1d0 * *(double *)((long)pvVar7 + lVar20 * 8) +
             dVar23;
    *(ulong *)((long)pvVar7 + lVar20 * 8) =
         ~(ulong)local_268 & (ulong)(local_1e8 + dVar23) | (ulong)dVar23 & (ulong)local_268;
    pdVar21 = pdVar21 + 1;
  }
  kase = 0;
  est = ferr + local_220;
  do {
    zlacon2_(&nrow,local_258 + A->nrow,local_258,est,&kase,isave);
    pdVar21 = local_258;
    if (kase == 1) {
      if (bVar15 == 0) {
        if (bVar22) {
          uVar13 = (ulong)(uint)A->nrow;
          if (A->nrow < 1) {
            uVar13 = 0;
          }
          for (lVar20 = 0; uVar13 * 8 != lVar20; lVar20 = lVar20 + 8) {
            *(double *)((long)&local_258->r + lVar20 * 2) =
                 *(double *)((long)&local_258->r + lVar20 * 2) * *(double *)((long)R + lVar20);
            *(double *)((long)&local_258->i + lVar20 * 2) =
                 *(double *)((long)&local_258->i + lVar20 * 2) * *(double *)((long)R + lVar20);
          }
        }
      }
      else {
        uVar13 = (ulong)(uint)A->ncol;
        if (A->ncol < 1) {
          uVar13 = 0;
        }
        for (lVar20 = 0; uVar13 * 8 != lVar20; lVar20 = lVar20 + 8) {
          *(double *)((long)&local_258->r + lVar20 * 2) =
               *(double *)((long)&local_258->r + lVar20 * 2) * *(double *)((long)C + lVar20);
          *(double *)((long)&local_258->i + lVar20 * 2) =
               *(double *)((long)&local_258->i + lVar20 * 2) * *(double *)((long)C + lVar20);
        }
      }
      zgstrs(local_234,local_1d8,local_1e0,local_1c0,local_1c8,&local_188,stat,info);
      uVar13 = (ulong)(uint)A->nrow;
      if (A->nrow < 1) {
        uVar13 = 0;
      }
      for (lVar20 = 0; uVar13 * 8 - lVar20 != 0; lVar20 = lVar20 + 8) {
        *(double *)((long)&pdVar21->r + lVar20 * 2) =
             *(double *)((long)&pdVar21->r + lVar20 * 2) * *(double *)((long)local_250 + lVar20);
        *(double *)((long)&pdVar21->i + lVar20 * 2) =
             *(double *)((long)&pdVar21->i + lVar20 * 2) * *(double *)((long)local_250 + lVar20);
      }
LAB_00104fb9:
      local_26c = (int)uVar13;
    }
    else {
      if (kase == 0) break;
      uVar13 = (ulong)(uint)A->nrow;
      if (A->nrow < 1) {
        uVar13 = 0;
      }
      for (lVar20 = 0; uVar13 * 8 - lVar20 != 0; lVar20 = lVar20 + 8) {
        *(double *)((long)&local_258->r + lVar20 * 2) =
             *(double *)((long)&local_258->r + lVar20 * 2) * *(double *)((long)local_250 + lVar20);
        *(double *)((long)&local_258->i + lVar20 * 2) =
             *(double *)((long)&local_258->i + lVar20 * 2) * *(double *)((long)local_250 + lVar20);
      }
      local_26c = (int)uVar13;
      zgstrs(trans,local_1d8,local_1e0,local_1c0,local_1c8,&local_188,stat,info);
      if (bVar15 != 0) {
        uVar13 = (ulong)(uint)A->ncol;
        if (A->ncol < 1) {
          uVar13 = 0;
        }
        for (lVar20 = 0; uVar13 * 8 - lVar20 != 0; lVar20 = lVar20 + 8) {
          *(double *)((long)&local_258->r + lVar20 * 2) =
               *(double *)((long)&local_258->r + lVar20 * 2) * *(double *)((long)C + lVar20);
          *(double *)((long)&local_258->i + lVar20 * 2) =
               *(double *)((long)&local_258->i + lVar20 * 2) * *(double *)((long)C + lVar20);
        }
        goto LAB_00104fb9;
      }
      if (bVar22) {
        uVar13 = (ulong)(uint)A->ncol;
        if (A->ncol < 1) {
          uVar13 = 0;
        }
        for (lVar20 = 0; uVar13 * 8 - lVar20 != 0; lVar20 = lVar20 + 8) {
          *(double *)((long)&local_258->r + lVar20 * 2) =
               *(double *)((long)&local_258->r + lVar20 * 2) * *(double *)((long)R + lVar20);
          *(double *)((long)&local_258->i + lVar20 * 2) =
               *(double *)((long)&local_258->i + lVar20 * 2) * *(double *)((long)R + lVar20);
        }
        goto LAB_00104fb9;
      }
    }
  } while (kase != 0);
  if (bVar15 == 0) {
    if (bVar22) {
      local_268 = 0.0;
      pdVar21 = local_210;
      for (lVar20 = 0; local_26c = (int)lVar20, local_26c < A->nrow; lVar20 = lVar20 + 1) {
        local_248 = R[lVar20];
        dVar23 = z_abs1(pdVar21);
        if (local_268 <= dVar23 * local_248) {
          local_268 = R[lVar20];
          dVar23 = z_abs1(pdVar21);
          local_268 = dVar23 * local_268;
        }
        pdVar21 = pdVar21 + 1;
      }
    }
    else {
      local_268 = 0.0;
      pdVar21 = local_210;
      for (iVar19 = 0; local_26c = iVar19, iVar19 < A->nrow; iVar19 = iVar19 + 1) {
        dVar23 = z_abs1(pdVar21);
        if (local_268 <= dVar23) {
          local_268 = z_abs1(pdVar21);
        }
        pdVar21 = pdVar21 + 1;
      }
    }
  }
  else {
    local_268 = 0.0;
    pdVar21 = local_210;
    for (lVar20 = 0; local_26c = (int)lVar20, local_26c < A->nrow; lVar20 = lVar20 + 1) {
      local_248 = C[lVar20];
      dVar23 = z_abs1(pdVar21);
      if (local_268 <= dVar23 * local_248) {
        local_268 = C[lVar20];
        dVar23 = z_abs1(pdVar21);
        local_268 = dVar23 * local_268;
      }
      pdVar21 = pdVar21 + 1;
    }
  }
  if ((local_268 != 0.0) || (NAN(local_268))) {
    *est = *est / local_268;
  }
  local_220 = local_220 + 1;
  local_1f0 = local_1f0 + lVar9;
  local_210 = local_210 + lVar11;
  goto LAB_00104713;
}

Assistant:

void
zgsrfs(trans_t trans, SuperMatrix *A, SuperMatrix *L, SuperMatrix *U,
       int *perm_c, int *perm_r, char *equed, double *R, double *C,
       SuperMatrix *B, SuperMatrix *X, double *ferr, double *berr,
       SuperLUStat_t *stat, int *info)
{


#define ITMAX 5
    
    /* Table of constant values */
    int    ione = 1, nrow = A->nrow;
    doublecomplex ndone = {-1., 0.};
    doublecomplex done = {1., 0.};
    
    /* Local variables */
    NCformat *Astore;
    doublecomplex   *Aval;
    SuperMatrix Bjcol;
    DNformat *Bstore, *Xstore, *Bjcol_store;
    doublecomplex   *Bmat, *Xmat, *Bptr, *Xptr;
    int      kase;
    double   safe1, safe2;
    int      i, j, k, irow, nz, count, notran, rowequ, colequ;
    int      ldb, ldx, nrhs;
    double   s, xk, lstres, eps, safmin;
    char     transc[1];
    trans_t  transt;
    doublecomplex   *work;
    double   *rwork;
    int      *iwork;
    int      isave[3];

    extern int zlacon2_(int *, doublecomplex *, doublecomplex *, double *, int *, int []);

    Astore = A->Store;
    Aval   = Astore->nzval;
    Bstore = B->Store;
    Xstore = X->Store;
    Bmat   = Bstore->nzval;
    Xmat   = Xstore->nzval;
    ldb    = Bstore->lda;
    ldx    = Xstore->lda;
    nrhs   = B->ncol;
    
    /* Test the input parameters */
    *info = 0;
    notran = (trans == NOTRANS);
    if ( !notran && trans != TRANS && trans != CONJ ) *info = -1;
    else if ( A->nrow != A->ncol || A->nrow < 0 ||
	      A->Stype != SLU_NC || A->Dtype != SLU_Z || A->Mtype != SLU_GE )
	*info = -2;
    else if ( L->nrow != L->ncol || L->nrow < 0 ||
 	      L->Stype != SLU_SC || L->Dtype != SLU_Z || L->Mtype != SLU_TRLU )
	*info = -3;
    else if ( U->nrow != U->ncol || U->nrow < 0 ||
 	      U->Stype != SLU_NC || U->Dtype != SLU_Z || U->Mtype != SLU_TRU )
	*info = -4;
    else if ( ldb < SUPERLU_MAX(0, A->nrow) ||
 	      B->Stype != SLU_DN || B->Dtype != SLU_Z || B->Mtype != SLU_GE )
        *info = -10;
    else if ( ldx < SUPERLU_MAX(0, A->nrow) ||
 	      X->Stype != SLU_DN || X->Dtype != SLU_Z || X->Mtype != SLU_GE )
	*info = -11;
    if (*info != 0) {
	i = -(*info);
	input_error("zgsrfs", &i);
	return;
    }

    /* Quick return if possible */
    if ( A->nrow == 0 || nrhs == 0) {
	for (j = 0; j < nrhs; ++j) {
	    ferr[j] = 0.;
	    berr[j] = 0.;
	}
	return;
    }

    rowequ = strncmp(equed, "R", 1)==0 || strncmp(equed, "B", 1)==0;
    colequ = strncmp(equed, "C", 1)==0 || strncmp(equed, "B", 1)==0;
    
    /* Allocate working space */
    work = doublecomplexMalloc(2*A->nrow);
    rwork = (double *) SUPERLU_MALLOC( A->nrow * sizeof(double) );
    iwork = int32Malloc(A->nrow);
    if ( !work || !rwork || !iwork ) 
        ABORT("Malloc fails for work/rwork/iwork.");
    
    if ( notran ) {
	*(unsigned char *)transc = 'N';
        transt = TRANS;
    } else if ( trans == TRANS ) {
	*(unsigned char *)transc = 'T';
	transt = NOTRANS;
    } else if ( trans == CONJ ) {
	*(unsigned char *)transc = 'C';
	transt = NOTRANS;
    }    

    /* NZ = maximum number of nonzero elements in each row of A, plus 1 */
    nz     = A->ncol + 1;
    eps    = dmach("Epsilon");
    safmin = dmach("Safe minimum");

    /* Set SAFE1 essentially to be the underflow threshold times the
       number of additions in each row. */
    safe1  = nz * safmin;
    safe2  = safe1 / eps;

    /* Compute the number of nonzeros in each row (or column) of A */
    for (i = 0; i < A->nrow; ++i) iwork[i] = 0;
    if ( notran ) {
	for (k = 0; k < A->ncol; ++k)
	    for (i = Astore->colptr[k]; i < Astore->colptr[k+1]; ++i) 
		++iwork[Astore->rowind[i]];
    } else {
	for (k = 0; k < A->ncol; ++k)
	    iwork[k] = Astore->colptr[k+1] - Astore->colptr[k];
    }	

    /* Copy one column of RHS B into Bjcol. */
    Bjcol.Stype = B->Stype;
    Bjcol.Dtype = B->Dtype;
    Bjcol.Mtype = B->Mtype;
    Bjcol.nrow  = B->nrow;
    Bjcol.ncol  = 1;
    Bjcol.Store = (void *) SUPERLU_MALLOC( sizeof(DNformat) );
    if ( !Bjcol.Store ) ABORT("SUPERLU_MALLOC fails for Bjcol.Store");
    Bjcol_store = Bjcol.Store;
    Bjcol_store->lda = ldb;
    Bjcol_store->nzval = work; /* address aliasing */
	
    /* Do for each right hand side ... */
    for (j = 0; j < nrhs; ++j) {
	count = 0;
	lstres = 3.;
	Bptr = &Bmat[j*ldb];
	Xptr = &Xmat[j*ldx];

	while (1) { /* Loop until stopping criterion is satisfied. */

	    /* Compute residual R = B - op(A) * X,   
	       where op(A) = A, A**T, or A**H, depending on TRANS. */
	    
#ifdef _CRAY
	    CCOPY(&nrow, Bptr, &ione, work, &ione);
#else
	    zcopy_(&nrow, Bptr, &ione, work, &ione);
#endif
	    sp_zgemv(transc, ndone, A, Xptr, ione, done, work, ione);

	    /* Compute componentwise relative backward error from formula 
	       max(i) ( abs(R(i)) / ( abs(op(A))*abs(X) + abs(B) )(i) )   
	       where abs(Z) is the componentwise absolute value of the matrix
	       or vector Z.  If the i-th component of the denominator is less
	       than SAFE2, then SAFE1 is added to the i-th component of the   
	       numerator before dividing. */

	    for (i = 0; i < A->nrow; ++i) rwork[i] = z_abs1( &Bptr[i] );
	    
	    /* Compute abs(op(A))*abs(X) + abs(B). */
	    if ( notran ) {
		for (k = 0; k < A->ncol; ++k) {
		    xk = z_abs1( &Xptr[k] );
		    for (i = Astore->colptr[k]; i < Astore->colptr[k+1]; ++i)
			rwork[Astore->rowind[i]] += z_abs1(&Aval[i]) * xk;
		}
	    } else {  /* trans = TRANS or CONJ */
		for (k = 0; k < A->ncol; ++k) {
		    s = 0.;
		    for (i = Astore->colptr[k]; i < Astore->colptr[k+1]; ++i) {
			irow = Astore->rowind[i];
			s += z_abs1(&Aval[i]) * z_abs1(&Xptr[irow]);
		    }
		    rwork[k] += s;
		}
	    }
	    s = 0.;
	    for (i = 0; i < A->nrow; ++i) {
		if (rwork[i] > safe2) {
		    s = SUPERLU_MAX( s, z_abs1(&work[i]) / rwork[i] );
                } else if ( rwork[i] != 0.0 ) {
		    s = SUPERLU_MAX( s, (z_abs1(&work[i]) + safe1) / rwork[i] );
                }
                /* If rwork[i] is exactly 0.0, then we know the true 
                   residual also must be exactly 0.0. */
	    }
	    berr[j] = s;

	    /* Test stopping criterion. Continue iterating if   
	       1) The residual BERR(J) is larger than machine epsilon, and   
	       2) BERR(J) decreased by at least a factor of 2 during the   
	          last iteration, and   
	       3) At most ITMAX iterations tried. */

	    if (berr[j] > eps && berr[j] * 2. <= lstres && count < ITMAX) {
		/* Update solution and try again. */
		zgstrs (trans, L, U, perm_c, perm_r, &Bjcol, stat, info);
		
#ifdef _CRAY
		CAXPY(&nrow, &done, work, &ione,
		       &Xmat[j*ldx], &ione);
#else
		zaxpy_(&nrow, &done, work, &ione,
		       &Xmat[j*ldx], &ione);
#endif
		lstres = berr[j];
		++count;
	    } else {
		break;
	    }
        
	} /* end while */

	stat->RefineSteps = count;

	/* Bound error from formula:
	   norm(X - XTRUE) / norm(X) .le. FERR = norm( abs(inv(op(A)))*   
	   ( abs(R) + NZ*EPS*( abs(op(A))*abs(X)+abs(B) ))) / norm(X)   
          where   
            norm(Z) is the magnitude of the largest component of Z   
            inv(op(A)) is the inverse of op(A)   
            abs(Z) is the componentwise absolute value of the matrix or
	       vector Z   
            NZ is the maximum number of nonzeros in any row of A, plus 1   
            EPS is machine epsilon   

          The i-th component of abs(R)+NZ*EPS*(abs(op(A))*abs(X)+abs(B))   
          is incremented by SAFE1 if the i-th component of   
          abs(op(A))*abs(X) + abs(B) is less than SAFE2.   

          Use ZLACON2 to estimate the infinity-norm of the matrix   
             inv(op(A)) * diag(W),   
          where W = abs(R) + NZ*EPS*( abs(op(A))*abs(X)+abs(B) ))) */
	
	for (i = 0; i < A->nrow; ++i) rwork[i] = z_abs1( &Bptr[i] );
	
	/* Compute abs(op(A))*abs(X) + abs(B). */
	if ( notran ) {
	    for (k = 0; k < A->ncol; ++k) {
		xk = z_abs1( &Xptr[k] );
		for (i = Astore->colptr[k]; i < Astore->colptr[k+1]; ++i)
		    rwork[Astore->rowind[i]] += z_abs1(&Aval[i]) * xk;
	    }
	} else {  /* trans == TRANS or CONJ */
	    for (k = 0; k < A->ncol; ++k) {
		s = 0.;
		for (i = Astore->colptr[k]; i < Astore->colptr[k+1]; ++i) {
		    irow = Astore->rowind[i];
		    xk = z_abs1( &Xptr[irow] );
		    s += z_abs1(&Aval[i]) * xk;
		}
		rwork[k] += s;
	    }
	}
	
	for (i = 0; i < A->nrow; ++i)
	    if (rwork[i] > safe2)
		rwork[i] = z_abs(&work[i]) + (iwork[i]+1)*eps*rwork[i];
	    else
		rwork[i] = z_abs(&work[i])+(iwork[i]+1)*eps*rwork[i]+safe1;
	kase = 0;

	do {
	    zlacon2_(&nrow, &work[A->nrow], work, &ferr[j], &kase, isave);
	    if (kase == 0) break;

	    if (kase == 1) {
		/* Multiply by diag(W)*inv(op(A)**T)*(diag(C) or diag(R)). */
		if ( notran && colequ )
		    for (i = 0; i < A->ncol; ++i) {
		        zd_mult(&work[i], &work[i], C[i]);
	            }
		else if ( !notran && rowequ )
		    for (i = 0; i < A->nrow; ++i) {
		        zd_mult(&work[i], &work[i], R[i]);
                    }

		zgstrs (transt, L, U, perm_c, perm_r, &Bjcol, stat, info);
		
		for (i = 0; i < A->nrow; ++i) {
		    zd_mult(&work[i], &work[i], rwork[i]);
	 	}
	    } else {
		/* Multiply by (diag(C) or diag(R))*inv(op(A))*diag(W). */
		for (i = 0; i < A->nrow; ++i) {
		    zd_mult(&work[i], &work[i], rwork[i]);
		}
		
		zgstrs (trans, L, U, perm_c, perm_r, &Bjcol, stat, info);
		
		if ( notran && colequ )
		    for (i = 0; i < A->ncol; ++i) {
		        zd_mult(&work[i], &work[i], C[i]);
		    }
		else if ( !notran && rowequ )
		    for (i = 0; i < A->ncol; ++i) {
		        zd_mult(&work[i], &work[i], R[i]);  
		    }
	    }
	    
	} while ( kase != 0 );

	/* Normalize error. */
	lstres = 0.;
 	if ( notran && colequ ) {
	    for (i = 0; i < A->nrow; ++i)
	    	lstres = SUPERLU_MAX( lstres, C[i] * z_abs1( &Xptr[i]) );
  	} else if ( !notran && rowequ ) {
	    for (i = 0; i < A->nrow; ++i)
	    	lstres = SUPERLU_MAX( lstres, R[i] * z_abs1( &Xptr[i]) );
	} else {
	    for (i = 0; i < A->nrow; ++i)
	    	lstres = SUPERLU_MAX( lstres, z_abs1( &Xptr[i]) );
	}
	if ( lstres != 0. )
	    ferr[j] /= lstres;

    } /* for each RHS j ... */
    
    SUPERLU_FREE(work);
    SUPERLU_FREE(rwork);
    SUPERLU_FREE(iwork);
    SUPERLU_FREE(Bjcol.Store);

    return;

}